

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleRoot.cpp
# Opt level: O3

BOOL __thiscall
Js::ModuleRoot::GetRootPropertyReference
          (ModuleRoot *this,Var originalInstance,PropertyId propertyId,Var *value,
          PropertyValueInfo *info,ScriptContext *requestContext)

{
  RecyclableObject *instance;
  PropertyIndex PVar1;
  int iVar2;
  BOOL BVar3;
  Var pvVar4;
  
  PVar1 = RootObjectBase::GetRootPropertyIndex(&this->super_RootObjectBase,propertyId);
  if (PVar1 != 0xffff) {
    pvVar4 = DynamicObject::GetSlot((DynamicObject *)this,(uint)PVar1);
    *value = pvVar4;
    if (info != (PropertyValueInfo *)0x0) {
      iVar2 = (*(this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x30])(this,(ulong)(uint)propertyId);
      info->m_instance = (RecyclableObject *)this;
      info->m_propertyIndex = PVar1;
      info->m_attributes = (iVar2 != 0) << 2;
      info->flags = InlineCacheNoFlags;
      iVar2 = (*(this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x23])(this,(ulong)(uint)propertyId);
      if (iVar2 != 0) {
        *(undefined1 *)&info->cacheInfoFlag = (char)info->cacheInfoFlag & 0xfb;
      }
    }
    return 1;
  }
  instance = (RecyclableObject *)(this->super_RootObjectBase).hostObject.ptr;
  if ((instance != (RecyclableObject *)0x0) &&
     (BVar3 = JavascriptOperators::GetPropertyReference
                        (instance,propertyId,value,requestContext,(PropertyValueInfo *)0x0),
     BVar3 != 0)) {
    return 1;
  }
  BVar3 = GlobalObject::GetRootPropertyReference
                    ((((((this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.
                         type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                     globalObject.ptr,originalInstance,propertyId,value,(PropertyValueInfo *)0x0,
                     requestContext);
  return BVar3;
}

Assistant:

BOOL ModuleRoot::GetRootPropertyReference(Var originalInstance, PropertyId propertyId, Var* value, PropertyValueInfo* info,
        ScriptContext* requestContext)
    {
        PropertyIndex index = GetRootPropertyIndex(propertyId);
        if (index != Constants::NoSlot)
        {
            *value = this->GetSlot(index);
            if (info) // Avoid testing IsWritable if info not being queried
            {
                PropertyValueInfo::Set(info, this, index, IsWritable(propertyId) ? PropertyWritable : PropertyNone);
#if ENABLE_FIXED_FIELDS
                if (this->IsFixedProperty(propertyId))
                {
                    PropertyValueInfo::DisableStoreFieldCache(info);
                }
#endif
            }
            return TRUE;
        }
        if (this->hostObject && JavascriptOperators::GetPropertyReference(this->hostObject, propertyId, value, requestContext))
        {
            return TRUE;
        }

        //
        // Try checking the global object
        // if the module root doesn't have the property and the host object also doesn't have it
        //

        GlobalObject* globalObj = this->GetLibrary()->GetGlobalObject();
        return globalObj->GlobalObject::GetRootPropertyReference(originalInstance, propertyId, value, NULL, requestContext);
    }